

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STVector256.cpp
# Opt level: O0

bool __thiscall jbcoin::STVector256::isEquivalent(STVector256 *this,STBase *t)

{
  bool local_39;
  long local_38;
  STVector256 *v;
  STBase *t_local;
  STVector256 *this_local;
  
  if (t == (STBase *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  }
  local_39 = false;
  if (local_38 != 0) {
    local_39 = std::operator==(&this->mValue,
                               (vector<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
                                *)(local_38 + 0x10));
  }
  return local_39;
}

Assistant:

bool
STVector256::isEquivalent (const STBase& t) const
{
    const STVector256* v = dynamic_cast<const STVector256*> (&t);
    return v && (mValue == v->mValue);
}